

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

Label __thiscall
asmjit::Assembler::newNamedLabel
          (Assembler *this,char *name,size_t nameLength,uint32_t type,uint32_t parentId)

{
  uint in_EAX;
  Error error;
  undefined4 in_register_0000000c;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  uint32_t in_R9D;
  Label LVar1;
  uint32_t id;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  if (*(int *)(name + 0x2c) == 0) {
    if (*(CodeHolder **)(name + 0x18) == (CodeHolder *)0x0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/assembler.cpp"
                 ,0xb5,"_code != nullptr");
    }
    error = CodeHolder::newNamedLabelId
                      (*(CodeHolder **)(name + 0x18),(uint32_t *)((long)&uStack_18 + 4),
                       (char *)nameLength,CONCAT44(in_register_0000000c,type),parentId,in_R9D);
    nameLength = extraout_RDX;
    if (error != 0) {
      CodeEmitter::setLastError((CodeEmitter *)name,error,(char *)0x0);
      nameLength = extraout_RDX_00;
    }
  }
  (this->super_CodeEmitter)._vptr_CodeEmitter = (_func_int **)(uStack_18 & 0xffffffff00000000 | 4);
  (this->super_CodeEmitter)._codeInfo._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  (this->super_CodeEmitter)._codeInfo.field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  LVar1.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)nameLength;
  LVar1.super_Operand.super_Operand_.field_0._packed[0] = (UInt64)this;
  return (Label)LVar1.super_Operand.super_Operand_.field_0;
}

Assistant:

Label Assembler::newNamedLabel(const char* name, size_t nameLength, uint32_t type, uint32_t parentId) {
  uint32_t id = 0;
  if (!_lastError) {
    ASMJIT_ASSERT(_code != nullptr);
    Error err = _code->newNamedLabelId(id, name, nameLength, type, parentId);
    if (ASMJIT_UNLIKELY(err)) setLastError(err);
  }
  return Label(id);
}